

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfPizCompressor.cpp
# Opt level: O0

int __thiscall
Imf_2_5::PizCompressor::uncompress
          (PizCompressor *this,char *inPtr,int inSize,Box2i *range,char **outPtr)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Channel *pCVar4;
  uchar *puVar5;
  InputExc *pIVar6;
  unsigned_short *lut_00;
  AutoArray<unsigned_short,_65536> *this_00;
  long lVar7;
  undefined4 *in_RCX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  undefined8 *in_R8;
  int n;
  ChannelData *cd_3;
  int i_3;
  int y_1;
  int x;
  ChannelData *cd_2;
  int i_2;
  int y;
  char *outEnd;
  int j;
  ChannelData *cd_1;
  int i_1;
  int length;
  unsigned_short maxValue;
  AutoArray<unsigned_short,_65536> lut;
  size_t bytesToRead;
  AutoArray<unsigned_char,_8192> bitmap;
  unsigned_short maxNonZero;
  unsigned_short minNonZero;
  ChannelData *cd;
  ConstIterator c;
  int i;
  unsigned_short *tmpBufferEnd;
  int maxY;
  int minY;
  int maxX;
  int minX;
  char *inputEnd;
  int in_stack_000052fc;
  unsigned_short *in_stack_00005300;
  int in_stack_0000530c;
  char *in_stack_00005310;
  undefined4 in_stack_fffffffffffffe88;
  undefined2 in_stack_fffffffffffffe8c;
  undefined2 in_stack_fffffffffffffe8e;
  unsigned_short v;
  AutoArray<unsigned_short,_65536> *in_stack_fffffffffffffe90;
  undefined4 in_stack_ffffffffffffff0c;
  undefined8 in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff1c;
  int iVar8;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  int local_d0;
  int local_cc;
  void *local_c8;
  int local_bc;
  int local_ac;
  int local_a8;
  AutoArray local_a0 [8];
  long local_98;
  AutoArray local_80 [12];
  ushort local_74;
  ushort local_72;
  long *local_70;
  const_iterator local_68;
  const_iterator local_60;
  int local_54;
  long local_50;
  int local_48;
  int local_44;
  int local_40;
  undefined4 local_3c;
  ulong local_38;
  undefined8 *local_30;
  int local_1c;
  long local_18;
  int local_4;
  
  local_38 = in_RSI + in_EDX;
  if (in_EDX == 0) {
    *in_R8 = *(undefined8 *)(in_RDI + 0x28);
    local_4 = 0;
  }
  else {
    local_3c = *in_RCX;
    local_40 = in_RCX[2];
    local_44 = in_RCX[1];
    local_48 = in_RCX[3];
    if (*(int *)(in_RDI + 0x50) < local_48) {
      local_48 = *(int *)(in_RDI + 0x50);
    }
    if (*(int *)(in_RDI + 0x4c) < local_40) {
      local_40 = *(int *)(in_RDI + 0x4c);
    }
    local_50 = *(long *)(in_RDI + 0x20);
    local_54 = 0;
    local_30 = in_R8;
    local_1c = in_EDX;
    local_18 = in_RSI;
    local_60._M_node =
         (_Base_ptr)
         ChannelList::begin((ChannelList *)
                            CONCAT26(in_stack_fffffffffffffe8e,
                                     CONCAT24(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88)))
    ;
    while( true ) {
      local_68._M_node =
           (_Base_ptr)
           ChannelList::end((ChannelList *)
                            CONCAT26(in_stack_fffffffffffffe8e,
                                     CONCAT24(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88)))
      ;
      bVar1 = Imf_2_5::operator!=((ConstIterator *)in_stack_fffffffffffffe90,
                                  (ConstIterator *)
                                  CONCAT26(in_stack_fffffffffffffe8e,
                                           CONCAT24(in_stack_fffffffffffffe8c,
                                                    in_stack_fffffffffffffe88)));
      if (!bVar1) break;
      local_70 = (long *)(*(long *)(in_RDI + 0x40) + (long)local_54 * 0x20);
      *local_70 = local_50;
      local_70[1] = *local_70;
      ChannelList::ConstIterator::channel((ConstIterator *)0x24d39d);
      iVar2 = numSamples((int)((ulong)in_stack_fffffffffffffe90 >> 0x20),
                         (int)in_stack_fffffffffffffe90,
                         CONCAT22(in_stack_fffffffffffffe8e,in_stack_fffffffffffffe8c));
      *(int *)(local_70 + 2) = iVar2;
      ChannelList::ConstIterator::channel((ConstIterator *)0x24d3cd);
      iVar2 = numSamples((int)((ulong)in_stack_fffffffffffffe90 >> 0x20),
                         (int)in_stack_fffffffffffffe90,
                         CONCAT22(in_stack_fffffffffffffe8e,in_stack_fffffffffffffe8c));
      *(int *)((long)local_70 + 0x14) = iVar2;
      pCVar4 = ChannelList::ConstIterator::channel((ConstIterator *)0x24d3fd);
      *(int *)(local_70 + 3) = pCVar4->ySampling;
      ChannelList::ConstIterator::channel((ConstIterator *)0x24d418);
      iVar2 = pixelTypeSize((PixelType)((ulong)in_stack_fffffffffffffe90 >> 0x20));
      iVar8 = pixelTypeSize((PixelType)((ulong)in_stack_fffffffffffffe90 >> 0x20));
      *(int *)((long)local_70 + 0x1c) = iVar2 / iVar8;
      local_50 = local_50 +
                 (long)((int)local_70[2] * *(int *)((long)local_70 + 0x14) *
                       *(int *)((long)local_70 + 0x1c)) * 2;
      ChannelList::ConstIterator::operator++((ConstIterator *)in_stack_fffffffffffffe90);
      local_54 = local_54 + 1;
    }
    AutoArray<unsigned_char,_8192>::AutoArray
              ((AutoArray<unsigned_char,_8192> *)in_stack_fffffffffffffe90);
    puVar5 = AutoArray::operator_cast_to_unsigned_char_(local_80);
    memset(puVar5,0,0x2000);
    if (local_38 < local_18 + 4U) {
      pIVar6 = (InputExc *)__cxa_allocate_exception(0x48);
      Iex_2_5::InputExc::InputExc(pIVar6,"PIZ compressed data too short");
      __cxa_throw(pIVar6,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
    }
    Xdr::read<Imf_2_5::CharPtrIO,char_const*>
              ((char **)in_stack_fffffffffffffe90,
               (unsigned_short *)
               CONCAT26(in_stack_fffffffffffffe8e,
                        CONCAT24(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88)));
    Xdr::read<Imf_2_5::CharPtrIO,char_const*>
              ((char **)in_stack_fffffffffffffe90,
               (unsigned_short *)
               CONCAT26(in_stack_fffffffffffffe8e,
                        CONCAT24(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88)));
    if (0x1fff < local_74) {
      pIVar6 = (InputExc *)__cxa_allocate_exception(0x48);
      Iex_2_5::InputExc::InputExc
                (pIVar6,"Error in header for PIZ-compressed data (invalid bitmap size).");
      __cxa_throw(pIVar6,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
    }
    if (local_72 <= local_74) {
      local_98 = (long)(int)(((uint)local_74 - (uint)local_72) + 1);
      if (local_38 < (ulong)(local_18 + local_98)) {
        pIVar6 = (InputExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::InputExc::InputExc(pIVar6,"PIZ compressed data too short");
        __cxa_throw(pIVar6,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
      }
      AutoArray::operator_cast_to_unsigned_char_(local_80);
      Xdr::read<Imf_2_5::CharPtrIO,char_const*>
                ((char **)in_stack_fffffffffffffe90,
                 (char *)CONCAT26(in_stack_fffffffffffffe8e,
                                  CONCAT24(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88)),0);
    }
    AutoArray<unsigned_short,_65536>::AutoArray(in_stack_fffffffffffffe90);
    puVar5 = AutoArray::operator_cast_to_unsigned_char_(local_80);
    lut_00 = AutoArray::operator_cast_to_unsigned_short_(local_a0);
    anon_unknown_0::reverseLutFromBitmap(puVar5,lut_00);
    if (local_38 < local_18 + 4U) {
      pIVar6 = (InputExc *)__cxa_allocate_exception(0x48);
      Iex_2_5::InputExc::InputExc(pIVar6,"PIZ compressed data too short");
      __cxa_throw(pIVar6,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
    }
    Xdr::read<Imf_2_5::CharPtrIO,char_const*>
              ((char **)in_stack_fffffffffffffe90,
               (int *)CONCAT26(in_stack_fffffffffffffe8e,
                               CONCAT24(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88)));
    if (local_1c < local_a8) {
      pIVar6 = (InputExc *)__cxa_allocate_exception(0x48);
      Iex_2_5::InputExc::InputExc
                (pIVar6,"Error in header for PIZ-compressed data (invalid array length).");
      __cxa_throw(pIVar6,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
    }
    hufUncompress(in_stack_00005310,in_stack_0000530c,in_stack_00005300,in_stack_000052fc);
    for (local_ac = 0; local_ac < *(int *)(in_RDI + 0x30); local_ac = local_ac + 1) {
      lVar7 = *(long *)(in_RDI + 0x40);
      for (local_bc = 0; local_bc < *(int *)(lVar7 + (long)local_ac * 0x20 + 0x1c);
          local_bc = local_bc + 1) {
        wav2Decode((unsigned_short *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                   in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18,
                   (int)((ulong)in_stack_ffffffffffffff10 >> 0x20),(int)in_stack_ffffffffffffff10,
                   (unsigned_short)((uint)in_stack_ffffffffffffff0c >> 0x10));
      }
    }
    this_00 = (AutoArray<unsigned_short,_65536> *)
              AutoArray::operator_cast_to_unsigned_short_(local_a0);
    anon_unknown_0::applyLut
              ((unsigned_short *)this_00,*(unsigned_short **)(in_RDI + 0x20),
               (int)((ulong)(local_50 - (long)*(unsigned_short **)(in_RDI + 0x20)) >> 1));
    local_c8 = *(void **)(in_RDI + 0x28);
    iVar2 = local_44;
    if (*(int *)(in_RDI + 0x14) == 1) {
      for (local_cc = local_44; local_cc <= local_48; local_cc = local_cc + 1) {
        for (local_d0 = 0; local_d0 < *(int *)(in_RDI + 0x30); local_d0 = local_d0 + 1) {
          lVar7 = *(long *)(in_RDI + 0x40) + (long)local_d0 * 0x20;
          iVar2 = Imath_2_5::modp((int)((ulong)this_00 >> 0x20),(int)this_00);
          v = (unsigned_short)((uint)iVar2 >> 0x10);
          if (iVar2 == 0) {
            for (iVar2 = *(int *)(lVar7 + 0x10) * *(int *)(lVar7 + 0x1c); 0 < iVar2;
                iVar2 = iVar2 + -1) {
              Xdr::write<Imf_2_5::CharPtrIO,char*>((char **)this_00,v);
              *(long *)(lVar7 + 8) = *(long *)(lVar7 + 8) + 2;
            }
          }
        }
      }
    }
    else {
      for (; iVar2 <= local_48; iVar2 = iVar2 + 1) {
        for (iVar8 = 0; iVar8 < *(int *)(in_RDI + 0x30); iVar8 = iVar8 + 1) {
          lVar7 = *(long *)(in_RDI + 0x40) + (long)iVar8 * 0x20;
          iVar3 = Imath_2_5::modp((int)((ulong)this_00 >> 0x20),(int)this_00);
          if (iVar3 == 0) {
            iVar3 = *(int *)(lVar7 + 0x10) * *(int *)(lVar7 + 0x1c);
            memcpy(local_c8,*(void **)(lVar7 + 8),(long)iVar3 << 1);
            local_c8 = (void *)((long)iVar3 * 2 + (long)local_c8);
            *(long *)(lVar7 + 8) = *(long *)(lVar7 + 8) + (long)iVar3 * 2;
          }
        }
      }
    }
    *local_30 = *(undefined8 *)(in_RDI + 0x28);
    local_4 = (int)local_c8 - (int)*(undefined8 *)(in_RDI + 0x28);
    AutoArray<unsigned_short,_65536>::~AutoArray(this_00);
    AutoArray<unsigned_char,_8192>::~AutoArray((AutoArray<unsigned_char,_8192> *)this_00);
  }
  return local_4;
}

Assistant:

int
PizCompressor::uncompress (const char *inPtr,
			   int inSize,
			   IMATH_NAMESPACE::Box2i range,
			   const char *&outPtr)
{
    //
    // This is the cunompress function which is used by both the tiled and
    // scanline decompression routines.
    //
   
    const char* inputEnd=inPtr+inSize;

    //
    // Special case - empty input buffer
    //

    if (inSize == 0)
    {
	outPtr = _outBuffer;
	return 0;
    }


    //
    // Determine the layout of the compressed pixel data
    //

    int minX = range.min.x;
    int maxX = range.max.x;
    int minY = range.min.y;
    int maxY = range.max.y;
    
    if (maxY > _maxY)
        maxY = _maxY;
    
    if (maxX > _maxX)
        maxX = _maxX;

    unsigned short *tmpBufferEnd = _tmpBuffer;
    int i = 0;

    for (ChannelList::ConstIterator c = _channels.begin();
	 c != _channels.end();
	 ++c, ++i)
    {
	ChannelData &cd = _channelData[i];

	cd.start = tmpBufferEnd;
	cd.end = cd.start;

	cd.nx = numSamples (c.channel().xSampling, minX, maxX);
	cd.ny = numSamples (c.channel().ySampling, minY, maxY);
	cd.ys = c.channel().ySampling;

	cd.size = pixelTypeSize (c.channel().type) / pixelTypeSize (HALF);

	tmpBufferEnd += cd.nx * cd.ny * cd.size;
    }

    //
    // Read range compression data
    //

    unsigned short minNonZero;
    unsigned short maxNonZero;

    AutoArray <unsigned char, BITMAP_SIZE> bitmap;
    memset (bitmap, 0, sizeof (unsigned char) * BITMAP_SIZE);


    if(inPtr + sizeof(unsigned short)*2 > inputEnd)
    {
   	   throw InputExc ("PIZ compressed data too short");
    }

    Xdr::read <CharPtrIO> (inPtr, minNonZero);
    Xdr::read <CharPtrIO> (inPtr, maxNonZero);

    if (maxNonZero >= BITMAP_SIZE)
    {
	throw InputExc ("Error in header for PIZ-compressed data "
			"(invalid bitmap size).");
    }

    if (minNonZero <= maxNonZero)
    {
        size_t bytesToRead = maxNonZero - minNonZero + 1;
	    if(inPtr + bytesToRead > inputEnd)
        {
   	      throw InputExc ("PIZ compressed data too short");
        }

Xdr::read <CharPtrIO> (inPtr, (char *) &bitmap[0] + minNonZero,
			       bytesToRead);
    }

    AutoArray <unsigned short, USHORT_RANGE> lut;
    unsigned short maxValue = reverseLutFromBitmap (bitmap, lut);

    //
    // Huffman decoding
    //
   if(inPtr + sizeof(int)> inputEnd)
   {
       throw InputExc ("PIZ compressed data too short");
   }


    int length;
    Xdr::read <CharPtrIO> (inPtr, length);

    if (length > inSize)
    {
	throw InputExc ("Error in header for PIZ-compressed data "
			"(invalid array length).");
    }

    hufUncompress (inPtr, length, _tmpBuffer, tmpBufferEnd - _tmpBuffer);

    //
    // Wavelet decoding
    //

    for (int i = 0; i < _numChans; ++i)
    {
	ChannelData &cd = _channelData[i];

	for (int j = 0; j < cd.size; ++j)
	{
	    wav2Decode (cd.start + j,
			cd.nx, cd.size,
			cd.ny, cd.nx * cd.size,
			maxValue);
	}
    }

    //
    // Expand the pixel data to their original range
    //

    applyLut (lut, _tmpBuffer, tmpBufferEnd - _tmpBuffer);
    
    //
    // Rearrange the pixel data into the format expected by the caller.
    //

    char *outEnd = _outBuffer;

    if (_format == XDR)
    {
	//
	// Machine-independent (Xdr) data format
	//

	for (int y = minY; y <= maxY; ++y)
	{
	    for (int i = 0; i < _numChans; ++i)
	    {
		ChannelData &cd = _channelData[i];

		if (modp (y, cd.ys) != 0)
		    continue;

		for (int x = cd.nx * cd.size; x > 0; --x)
		{
		    Xdr::write <CharPtrIO> (outEnd, *cd.end);
		    ++cd.end;
		}
	    }
	}
    }
    else
    {
	//
	// Native, machine-dependent data format
	//

	for (int y = minY; y <= maxY; ++y)
	{
	    for (int i = 0; i < _numChans; ++i)
	    {
		ChannelData &cd = _channelData[i];

		if (modp (y, cd.ys) != 0)
		    continue;

		int n = cd.nx * cd.size;
		memcpy (outEnd, cd.end, n * sizeof (unsigned short));
		outEnd += n * sizeof (unsigned short);
		cd.end += n;
	    }
	}
    }

    #if defined (DEBUG)

	for (int i = 1; i < _numChans; ++i)
	    assert (_channelData[i-1].end == _channelData[i].start);

	assert (_channelData[_numChans-1].end == tmpBufferEnd);

    #endif

    outPtr = _outBuffer;
    return outEnd - _outBuffer;
}